

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O2

int ncnn::binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_add>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float fVar1;
  uint uVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  float *pfVar15;
  float *pfVar16;
  int iVar17;
  
  uVar2 = a->c;
  iVar13 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar17 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    for (uVar12 = 0; uVar12 != uVar2; uVar12 = uVar12 + 1) {
      pvVar3 = a->data;
      sVar4 = a->elemsize;
      sVar5 = a->cstep;
      pfVar16 = (float *)(sVar5 * uVar12 * sVar4 + (long)pvVar3);
      fVar1 = *b->data;
      pvVar6 = c->data;
      sVar7 = c->elemsize;
      sVar8 = c->cstep;
      pfVar15 = (float *)(sVar8 * uVar12 * sVar7 + (long)pvVar6);
      lVar14 = 0;
      for (iVar17 = 0; iVar17 + 3 < iVar13; iVar17 = iVar17 + 4) {
        fVar9 = pfVar16[1];
        fVar10 = pfVar16[2];
        fVar11 = pfVar16[3];
        *pfVar15 = *pfVar16 + fVar1;
        pfVar15[1] = fVar9 + fVar1;
        pfVar15[2] = fVar10 + fVar1;
        pfVar15[3] = fVar11 + fVar1;
        pfVar16 = pfVar16 + 4;
        pfVar15 = pfVar15 + 4;
        lVar14 = lVar14 + 4;
      }
      for (; (int)lVar14 < iVar13; lVar14 = lVar14 + 1) {
        *(float *)((long)pvVar6 + lVar14 * 4 + sVar8 * sVar7 * uVar12) =
             *(float *)((long)pvVar3 + lVar14 * 4 + sVar5 * sVar4 * uVar12) + fVar1;
      }
    }
    iVar17 = 0;
  }
  return iVar17;
}

Assistant:

static int binary_op_6_11_16_25(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 6 11 16 25
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float b0 = b[0];
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b0_avx512 = _mm512_set1_ps(b0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_p, _b0_avx512);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b0_avx = _mm256_set1_ps(b0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_p, _b0_avx);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b0 = _mm_set1_ps(b0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_p, _b0);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b0);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}